

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_CheckProximity
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double distance_00;
  AActor *self_00;
  PClass *this;
  int iVar1;
  VMValue *pVVar2;
  bool bVar3;
  bool local_66;
  bool local_63;
  int local_5c;
  int u;
  int ptr;
  int flags;
  int count;
  double distance;
  MetaClass *classname;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1971,
                  "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1971,
                  "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self_00 = (AActor *)(param->field_0).field_1.a;
  local_63 = true;
  if (self_00 != (AActor *)0x0) {
    local_63 = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
  }
  if (local_63 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1971,
                  "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1972,
                  "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar3 = true, param[1].field_0.field_1.atag != 1)) {
    bVar3 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar3) {
    this = (PClass *)param[1].field_0.field_1.a;
    local_66 = true;
    if (this != (PClass *)0x0) {
      local_66 = PClass::IsDescendantOf(this,AActor::RegistrationInfo.MyClass);
    }
    if (local_66 == false) {
      __assert_fail("classname == NULL || classname->IsDescendantOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1972,
                    "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1973,
                    "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[2].field_0.field_3.Type != '\x01') {
      __assert_fail("param[paramnum].Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1973,
                    "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    distance_00 = param[2].field_0.f;
    if (numparam < 4) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      if ((pVVar2->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1974,
                      "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      ptr = (pVVar2->field_0).i;
    }
    else {
      if (param[3].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1974,
                      "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      ptr = param[3].field_0.i;
    }
    if (numparam < 5) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      if ((pVVar2->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1975,
                      "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      u = (pVVar2->field_0).i;
    }
    else {
      if (param[4].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1975,
                      "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      u = param[4].field_0.i;
    }
    if (numparam < 6) {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      if ((pVVar2->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1976,
                      "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      local_5c = (pVVar2->field_0).i;
    }
    else {
      if (param[5].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1976,
                      "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      local_5c = param[5].field_0.i;
    }
    iVar1 = P_Thing_CheckProximity(self_00,this,distance_00,ptr,u,local_5c,false);
    if (numret < 1) {
      param_local._4_4_ = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1978,
                      "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      VMReturn::SetInt(ret,(uint)(iVar1 != 0));
      param_local._4_4_ = 1;
    }
    return param_local._4_4_;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1972,
                "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckProximity)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(classname, AActor);
	PARAM_FLOAT(distance);
	PARAM_INT_DEF(count);
	PARAM_INT_DEF(flags);
	PARAM_INT_DEF(ptr);

	ACTION_RETURN_BOOL(!!P_Thing_CheckProximity(self, classname, distance, count, flags, ptr));
}